

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

int lj_tab_isarray(GCtab *src)

{
  double dVar1;
  uint64_t uVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  lua_Number n;
  ptrdiff_t i;
  cTValue *o;
  Node *node;
  GCtab *src_local;
  
  uVar2 = (src->node).ptr64;
  n = (lua_Number)(ulong)src->hmask;
  while( true ) {
    if ((long)n < 0) {
      return 1;
    }
    if ((*(long *)(uVar2 + (long)n * 0x18) != -1) &&
       ((pdVar3 = (double *)(uVar2 + (long)n * 0x18 + 8), 0xfffffff1 < (uint)((long)*pdVar3 >> 0x2f)
        || (dVar1 = *pdVar3, auVar4._8_8_ = 0, auVar4._0_8_ = dVar1,
           auVar4 = roundsd(auVar4,auVar4,4), auVar4._0_8_ != dVar1)))) break;
    n = (lua_Number)((long)n + -1);
  }
  return 0;
}

Assistant:

int LJ_FASTCALL lj_tab_isarray(const GCtab *src)
{
  Node *node;
  cTValue *o;
  ptrdiff_t i;

  node = noderef(src->node);
  for (i = (ptrdiff_t)src->hmask; i >= 0; i--)
    if (!tvisnil(&node[i].val)) {
      o = &node[i].key;
      if (LJ_UNLIKELY(tvisint(o))) {
        continue;
      }
      if (LJ_UNLIKELY(tvisnum(o))) {
        lua_Number n = numberVnum(o);
        if (LJ_LIKELY(rint((double) n) == n)) {
          continue;
        }
      }
      return 0;
    }

  return 1;
}